

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab5.c
# Opt level: O2

int FeedCompressBig1(void)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  uint n;
  uchar *__s;
  
  InputLength = 0;
  bVar4 = 0;
  while( true ) {
    sVar1 = InputLength;
    if (AlphabetSize <= bVar4) {
      iVar3 = FeedCompress();
      return iVar3;
    }
    n = (uint)bVar4;
    uVar2 = CalcFib(n);
    if (0x2000000 < sVar1 + uVar2) break;
    __s = Input + InputLength;
    uVar2 = CalcFib(n);
    memset(__s,n,(ulong)uVar2);
    uVar2 = CalcFib(n);
    InputLength = uVar2 + InputLength;
    bVar4 = bVar4 + 1;
  }
  printf("Tester error: generated input is too large");
  return -1;
}

Assistant:

static int FeedCompressBig1(void) {
    InputLength = 0;
    for (unsigned char c = 0; c < AlphabetSize; ++c) {
        if (IsInputTooLarge(InputLength + CalcFib(c))) {
            return -1;
        }
        memset(Input + InputLength, c, CalcFib(c));
        InputLength += CalcFib(c);
    }
    return FeedCompress();
}